

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O1

bool __thiscall
HighsHashTable<int,double>::insert<HighsHashTableEntry<int,double>>
          (HighsHashTable<int,double> *this,HighsHashTableEntry<int,_double> *args)

{
  undefined8 *puVar1;
  byte bVar2;
  u8 uVar3;
  long lVar4;
  undefined8 uVar5;
  double dVar6;
  bool bVar7;
  ulong uVar8;
  u8 meta;
  u64 pos;
  u64 maxPos;
  Entry entry;
  u64 startPos;
  u8 local_49;
  ulong local_48;
  ulong local_40;
  HighsHashTableEntry<int,_double> local_38;
  ulong local_20;
  HighsHashTableEntry<int,_double> local_18;
  
  local_38.key_ = args->key_;
  local_38._4_4_ = *(undefined4 *)&args->field_0x4;
  local_38.value_ = args->value_;
  bVar7 = HighsHashTable<int,_double>::findPosition
                    ((HighsHashTable<int,_double> *)this,&local_38.key_,&local_49,&local_20,
                     &local_40,&local_48);
  if (bVar7) {
    bVar7 = false;
  }
  else if ((*(ulong *)(this + 0x20) == *(long *)(this + 0x10) * 7 + 7U >> 3) ||
          (local_48 == local_40)) {
    HighsHashTable<int,_double>::growTable((HighsHashTable<int,_double> *)this);
    bVar7 = insert<HighsHashTableEntry<int,double>>(this,&local_38);
  }
  else {
    lVar4 = *(long *)this;
    *(ulong *)(this + 0x20) = *(ulong *)(this + 0x20) + 1;
    do {
      bVar2 = *(byte *)(*(long *)(this + 8) + local_48);
      if (-1 < (char)bVar2) {
        *(u8 *)(*(long *)(this + 8) + local_48) = local_49;
        puVar1 = (undefined8 *)(lVar4 + local_48 * 0x10);
        *puVar1 = local_38._0_8_;
        puVar1[1] = local_38.value_;
        goto LAB_0027efe1;
      }
      uVar8 = (ulong)((int)local_48 - (uint)bVar2 & 0x7f);
      if (uVar8 < (local_48 - local_20 & *(ulong *)(this + 0x10))) {
        local_18.key_ = local_38.key_;
        local_18._4_4_ = local_38._4_4_;
        local_18.value_ = local_38.value_;
        puVar1 = (undefined8 *)(lVar4 + local_48 * 0x10);
        uVar5 = *puVar1;
        dVar6 = (double)puVar1[1];
        puVar1 = (undefined8 *)(lVar4 + local_48 * 0x10);
        *puVar1 = local_38._0_8_;
        puVar1[1] = local_38.value_;
        uVar3 = *(u8 *)(*(long *)(this + 8) + local_48);
        *(u8 *)(*(long *)(this + 8) + local_48) = local_49;
        local_20 = local_48 - uVar8 & *(ulong *)(this + 0x10);
        local_40 = local_20 + 0x7f & *(ulong *)(this + 0x10);
        local_49 = uVar3;
        local_38._0_8_ = uVar5;
        local_38.value_ = dVar6;
      }
      local_48 = local_48 + 1 & *(ulong *)(this + 0x10);
    } while (local_48 != local_40);
    HighsHashTable<int,_double>::growTable((HighsHashTable<int,_double> *)this);
    insert<HighsHashTableEntry<int,double>>(this,&local_38);
LAB_0027efe1:
    bVar7 = true;
  }
  return bVar7;
}

Assistant:

bool insert(Args&&... args) {
    Entry entry(std::forward<Args>(args)...);

    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(entry.key(), meta, startPos, maxPos, pos)) return false;

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return insert(std::move(entry));
    }

    using std::swap;
    Entry* entryArray = entries.get();
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return true;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return true;
  }